

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

Gia_Man_t * Of_ManDeriveMapping(Of_Man_t *p)

{
  uint *puVar1;
  Jf_Par_t *pJVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *p_01;
  void *__s;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint Entry;
  Gia_Man_t *pGVar10;
  uint *puVar11;
  ulong uVar12;
  
  pJVar2 = p->pPars;
  if ((pJVar2->fCutMin != 0) || (p->pGia->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x6c2,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
  }
  uVar3 = p->pGia->nObjs;
  iVar7 = (int)pJVar2->Edge + uVar3;
  iVar5 = (int)pJVar2->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < (iVar7 + iVar5 * 2) - 1U) {
    iVar8 = iVar7 + iVar5 * 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar4;
  if (iVar8 < (int)uVar3) {
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar3 << 2);
    }
    p_00->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset(p_00->pArray,0,(ulong)uVar3 * 4);
  }
  p_00->nSize = uVar3;
  if (pJVar2->nFastEdges == 0) {
    p_01 = (Vec_Int_t *)0x0;
  }
  else {
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar4 = (int *)malloc(4000);
    p_01->pArray = piVar4;
    Vec_IntPush(p_01,0);
  }
  uVar3 = p->pGia->nObjs;
  iVar5 = (((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
  if (iVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar5 * 4);
  }
  memset(__s,0,(long)iVar5 << 2);
  pGVar10 = p->pGia;
  if (0 < pGVar10->nObjs) {
    uVar12 = 0;
    do {
      uVar3 = (uint)*(undefined8 *)(pGVar10->pObjs + uVar12);
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        if (p->pObjs[uVar12].nRefs != 0) {
          if (((-1 < (int)uVar3) && ((uVar3 & 0x1fffffff) != 0x1fffffff)) &&
             ((uVar3 & 0x1fffffff) ==
              ((uint)((ulong)*(undefined8 *)(pGVar10->pObjs + uVar12) >> 0x20) & 0x1fffffff))) {
            __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x6cf,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
          }
          if (uVar12 == 0) {
            __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
          }
          uVar3 = p->pObjs[uVar12].iCutH;
          uVar6 = (int)uVar3 >> 0x10;
          if (((int)uVar6 < 0) || ((p->vPages).nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if ((long)p_00->nSize <= (long)uVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          puVar11 = (uint *)((ulong)((uVar3 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar6]);
          p_00->pArray[uVar12] = p_00->nSize;
          Vec_IntPush(p_00,*puVar11 & 0x1f);
          if ((*puVar11 & 0x1f) != 0) {
            uVar9 = 0;
            do {
              uVar3 = puVar11[uVar9 + 1];
              if ((int)uVar3 < 0) goto LAB_007549f6;
              if (uVar3 < 2) break;
              Vec_IntPush(p_00,uVar3 >> 1);
              uVar9 = uVar9 + 1;
            } while (uVar9 < (*puVar11 & 0x1f));
          }
          uVar3 = (uint)uVar12;
          Vec_IntPush(p_00,uVar3);
          if (p_01 != (Vec_Int_t *)0x0) {
            if ((long)(iVar5 * 0x20) <= (long)uVar12) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if ((*(uint *)((long)__s + (uVar12 >> 5 & 0x7ffffff) * 4) >> (uVar3 & 0x1f) & 1) == 0) {
              uVar6 = p_01->nSize;
              Vec_IntPush(p_01,0);
              Vec_IntPush(p_01,uVar3);
              if ((*puVar11 & 0x1f) != 0) {
                uVar9 = 0;
                do {
                  uVar3 = puVar11[uVar9 + 1];
                  if ((int)uVar3 < 0) {
LAB_007549f6:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  if (uVar3 < 2) break;
                  if ((uVar3 & 1) != 0) {
                    Entry = uVar3 >> 1;
                    Vec_IntPush(p_01,Entry);
                    if (iVar5 * 0x20 <= (int)Entry) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
                    }
                    puVar1 = (uint *)((long)__s + (ulong)(uVar3 >> 6) * 4);
                    *puVar1 = *puVar1 | 1 << ((byte)Entry & 0x1f);
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar9 < (*puVar11 & 0x1f));
              }
              if (((int)uVar6 < 0) || (p_01->nSize <= (int)uVar6)) {
LAB_00754acf:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
              }
              piVar4 = p_01->pArray;
              piVar4[uVar6] = piVar4[uVar6] + p_01->nSize + ~uVar6;
              if (p_01->nSize < 1) goto LAB_00754acf;
              *piVar4 = *piVar4 + 1;
            }
          }
        }
      }
      uVar12 = uVar12 + 1;
      pGVar10 = p->pGia;
    } while ((long)uVar12 < (long)pGVar10->nObjs);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x6e4,"Gia_Man_t *Of_ManDeriveMapping(Of_Man_t *)");
  }
  pGVar10->vMapping = p_00;
  pGVar10->vPacking = p_01;
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pGVar10;
}

Assistant:

Gia_Man_t * Of_ManDeriveMapping( Of_Man_t * p )
{
    Vec_Int_t * vMapping, * vPacking = NULL;
    Vec_Bit_t * vPointed; 
    int i, k, iVar, * pCut, Place, Flag;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    if ( p->pPars->nFastEdges )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    vPointed = Vec_BitStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Of_ObjRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Of_ObjCutBestP( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Of_CutSize(pCut) );
        Of_CutForEachVar( pCut, iVar, k )
            Vec_IntPush( vMapping, iVar );
        Vec_IntPush( vMapping, i );
        if ( vPacking == NULL || Vec_BitEntry(vPointed, i) )
            continue;
        Place = Vec_IntSize( vPacking );
        Vec_IntPush( vPacking, 0 );
        Vec_IntPush( vPacking, i );
        Of_CutForEachVarFlag( pCut, iVar, Flag, k )
            if ( Flag )
            {
                Vec_IntPush( vPacking, iVar );
                Vec_BitWriteEntry( vPointed, iVar, 1 );
            }
        Vec_IntAddToEntry( vPacking, Place, Vec_IntSize(vPacking)-Place-1 );
        Vec_IntAddToEntry( vPacking, 0, 1 );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    p->pGia->vPacking = vPacking;
    Vec_BitFree( vPointed );
    return p->pGia;
}